

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddDefaultValue(Parse *pParse,ExprSpan *pSpan)

{
  sqlite3 *db_00;
  Table *pTVar1;
  int iVar2;
  Column *pCVar3;
  Expr *pEVar4;
  char *pcVar5;
  sqlite3 *db;
  Column *pCol;
  Table *p;
  ExprSpan *pSpan_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    pCVar3 = pTVar1->aCol + (pTVar1->nCol + -1);
    iVar2 = sqlite3ExprIsConstantOrFunction(pSpan->pExpr);
    if (iVar2 == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCVar3->zName);
    }
    else {
      sqlite3ExprDelete(db_00,pCVar3->pDflt);
      pEVar4 = sqlite3ExprDup(db_00,pSpan->pExpr,1);
      pCVar3->pDflt = pEVar4;
      sqlite3DbFree(db_00,pCVar3->zDflt);
      pcVar5 = sqlite3DbStrNDup(db_00,pSpan->zStart,(int)pSpan->zEnd - (int)pSpan->zStart);
      pCVar3->zDflt = pcVar5;
    }
  }
  sqlite3ExprDelete(db_00,pSpan->pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(Parse *pParse, ExprSpan *pSpan){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pSpan->pExpr) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory. The 'span' of the expression
      ** is required by pragma table_info.
      */
      sqlite3ExprDelete(db, pCol->pDflt);
      pCol->pDflt = sqlite3ExprDup(db, pSpan->pExpr, EXPRDUP_REDUCE);
      sqlite3DbFree(db, pCol->zDflt);
      pCol->zDflt = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                     (int)(pSpan->zEnd - pSpan->zStart));
    }
  }
  sqlite3ExprDelete(db, pSpan->pExpr);
}